

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  rnndelem *prVar2;
  char *pcVar3;
  rnndelem **pprVar4;
  rnndelem *prVar5;
  int local_24;
  int i;
  rnndelem *res;
  char *file_local;
  rnndelem *elem_local;
  
  prVar2 = (rnndelem *)calloc(0x110,1);
  prVar2->type = elem->type;
  prVar2->name = elem->name;
  if (prVar2->name != (char *)0x0) {
    pcVar3 = strdup(prVar2->name);
    prVar2->name = pcVar3;
  }
  prVar2->width = elem->width;
  prVar2->access = elem->access;
  prVar2->offset = elem->offset;
  prVar2->length = elem->length;
  prVar2->stride = elem->stride;
  copyvarinfo(&prVar2->varinfo,&elem->varinfo);
  prVar2->file = file;
  copytypeinfo(&prVar2->typeinfo,&elem->typeinfo,file);
  for (local_24 = 0; local_24 < elem->subelemsnum; local_24 = local_24 + 1) {
    if (prVar2->subelemsmax <= prVar2->subelemsnum) {
      if (prVar2->subelemsmax == 0) {
        prVar2->subelemsmax = 0x10;
      }
      else {
        prVar2->subelemsmax = prVar2->subelemsmax << 1;
      }
      pprVar4 = (rnndelem **)realloc(prVar2->subelems,(long)prVar2->subelemsmax << 3);
      prVar2->subelems = pprVar4;
    }
    prVar5 = copydelem(elem->subelems[local_24],file);
    iVar1 = prVar2->subelemsnum;
    prVar2->subelemsnum = iVar1 + 1;
    prVar2->subelems[iVar1] = prVar5;
  }
  return prVar2;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	if (res->name)
		res->name = strdup(res->name);
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	copyvarinfo(&res->varinfo, &elem->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}